

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O1

vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> * __thiscall
cali::StringConverter::rec_list
          (vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar7;
  char *pcVar6;
  byte bVar8;
  string str;
  istringstream is;
  string local_208;
  undefined8 local_1e8;
  vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> *local_1e0;
  char *local_1d8;
  long local_1d0;
  char local_1c8;
  undefined7 uStack_1c7;
  bool *local_1b8;
  long local_1b0 [4];
  int aiStack_190 [22];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cali::StringConverter,_std::allocator<cali::StringConverter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)this,_S_in);
  cVar4 = util::read_char((istream *)local_1b0);
  if ((cVar4 != '[') && (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) == 0)) {
    std::istream::unget();
  }
  paVar1 = &local_208.field_2;
  local_1e8 = 0;
  local_1b8 = okptr;
  do {
    cVar5 = util::read_char((istream *)local_1b0);
    pcVar6 = &local_1c8;
    local_1d0 = 0;
    local_1c8 = '\0';
    local_1d8 = pcVar6;
    if (cVar5 == '[') {
      cVar5 = '\x01';
      std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x228869);
      util::read_nested_text_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)0x5b,']',cVar5);
      std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_208._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      cVar5 = util::read_char((istream *)local_1b0);
      uVar7 = extraout_var_00;
      if (cVar5 == ']') goto LAB_00190f7d;
LAB_00190ff7:
      local_1e8 = CONCAT71(uVar7,1);
      bVar3 = false;
    }
    else {
      if (cVar5 == '{') {
        cVar5 = '\x01';
        std::__cxx11::string::_M_replace((ulong)&local_1d8,0,(char *)0x0,0x2287a7);
        util::read_nested_text_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)0x7b,'}',cVar5);
        std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_208._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        cVar5 = util::read_char((istream *)local_1b0);
        uVar7 = extraout_var;
        if (cVar5 != '}') goto LAB_00190ff7;
LAB_00190f7d:
        std::__cxx11::string::append((char *)&local_1d8);
      }
      else {
        std::istream::unget();
        util::read_word_abi_cxx11_(&local_208,(util *)local_1b0,(istream *)",]",pcVar6);
        std::__cxx11::string::operator=((string *)&local_1d8,(string *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1d0 != 0) {
        local_208._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,local_1d8,local_1d8 + local_1d0);
        std::vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>::
        emplace_back<cali::StringConverter>(local_1e0,(StringConverter *)&local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar1) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
      }
      cVar5 = util::read_char((istream *)local_1b0);
      bVar3 = true;
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
    }
    if ((!bVar3) || (*(int *)((long)aiStack_190 + *(long *)(local_1b0[0] + -0x18)) != 0)) break;
    pcVar6 = ",";
    do {
      cVar2 = *pcVar6;
      if (cVar2 == cVar5) break;
      pcVar6 = pcVar6 + 1;
    } while (cVar2 != '\0');
  } while (cVar2 != '\0');
  if (cVar4 == '[') {
    bVar8 = 1;
    if (cVar5 == ']') {
      bVar8 = (byte)local_1e8;
    }
  }
  else {
    std::istream::unget();
    bVar8 = (byte)local_1e8;
  }
  if (local_1b8 != (bool *)0x0) {
    *local_1b8 = (bool)(~bVar8 & 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return local_1e0;
}

Assistant:

std::vector<cali::StringConverter> cali::StringConverter::rec_list(bool* okptr) const
{
    std::vector<StringConverter> ret;
    bool                         error = false;
    char                         c;

    std::istringstream is(m_str);

    int d = 0;
    c     = util::read_char(is);

    if (c == '[')
        ++d;
    else if (is.good())
        is.unget();

    do {
        c = util::read_char(is);
        std::string str;

        if (c == '{') {
            str = "{";
            str.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }

            str.append("}");
        } else if (c == '[') {
            str = "[";
            str.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            str.append("]");
        } else {
            is.unget();
            str = util::read_word(is, ",]");
        }

        if (!str.empty())
            ret.push_back(StringConverter(str));

        c = util::read_char(is);
    } while (is.good() && util::is_one_of(c, ","));

    if (d > 0) {
        if (c != ']')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}